

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

void trstep_ddl(double *jac,double *sN,int N,double *dx,double maxstep,double *L,double *hess,
               double nlen,double *ioval,double *ssd,double *v,double *step)

{
  double *vec;
  double *C;
  double *C_00;
  double *C_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double *t2;
  double *t1;
  double *slstep;
  double *temp1;
  double lambda;
  double neta;
  double clen;
  double delta;
  double beta;
  double alpha;
  double temp;
  double tvec;
  int j;
  int i;
  double nlen_local;
  double *hess_local;
  double *L_local;
  double maxstep_local;
  double *dx_local;
  int N_local;
  double *sN_local;
  double *jac_local;
  
  clen = *ioval;
  neta = ioval[1];
  lambda = ioval[2];
  vec = (double *)malloc((long)N << 3);
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  C_01 = (double *)malloc(8);
  if (clen < nlen) {
    ioval[6] = 0.0;
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
        vec[tvec._4_4_] = jac[tvec._4_4_] / dx[tvec._4_4_];
      }
      dVar1 = l2norm(vec,N);
      dVar1 = dVar1 * dVar1;
      delta = 0.0;
      for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
        alpha = 0.0;
        for (tvec._0_4_ = tvec._4_4_; tvec._0_4_ < N; tvec._0_4_ = tvec._0_4_ + 1) {
          alpha = (L[tvec._0_4_ * N + tvec._4_4_] * jac[tvec._0_4_]) /
                  (dx[tvec._0_4_] * dx[tvec._0_4_]) + alpha;
        }
        delta = alpha * alpha + delta;
      }
      for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
        ssd[tvec._4_4_] = ((-dVar1 / delta) * jac[tvec._4_4_]) / dx[tvec._4_4_];
      }
      dVar2 = sqrt(dVar1);
      neta = (dVar1 * dVar2) / delta;
      mmult(jac,sN,C,1,N,1);
      lambda = (dVar1 * 0.8 * dVar1) / (delta * ABS(*C)) + 0.2;
      for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
        v[tvec._4_4_] = lambda * dx[tvec._4_4_] * sN[tvec._4_4_] + -ssd[tvec._4_4_];
      }
      if (((clen == -1.0) && (!NAN(clen))) && (clen = maxstep, neta < maxstep)) {
        clen = neta;
      }
    }
    if (clen < lambda * nlen) {
      if (neta < clen) {
        mmult(v,ssd,C_00,1,N,1);
        mmult(v,v,C_01,1,N,1);
        dVar1 = *C_00;
        dVar3 = sqrt(*C_00 * *C_00 + -(*C_01 * (neta * neta + -(clen * clen))));
        dVar2 = *C_01;
        for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
          step[tvec._4_4_] =
               ssd[tvec._4_4_] / dx[tvec._4_4_] +
               (((-dVar1 + dVar3) / dVar2) * v[tvec._4_4_]) / dx[tvec._4_4_];
        }
      }
      else {
        for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
          step[tvec._4_4_] = ((clen / neta) * ssd[tvec._4_4_]) / dx[tvec._4_4_];
        }
      }
    }
    else {
      for (tvec._4_4_ = 0; tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
        step[tvec._4_4_] = (clen / nlen) * sN[tvec._4_4_];
      }
    }
  }
  else {
    ioval[6] = 1.0;
    for (tvec._4_4_ = 0; clen = nlen, tvec._4_4_ < N; tvec._4_4_ = tvec._4_4_ + 1) {
      step[tvec._4_4_] = sN[tvec._4_4_];
    }
  }
  *ioval = clen;
  ioval[1] = neta;
  ioval[2] = lambda;
  free(vec);
  free(C_00);
  free(C_01);
  free(C);
  return;
}

Assistant:

void trstep_ddl(double *jac,double *sN,int N,double * dx,double maxstep,double *L,double *hess,double nlen,double *ioval,
		double *ssd,double *v,double *step) {
	int i,j;
	double tvec,temp;
	double alpha,beta;
	double delta,clen,neta,lambda;
	double *temp1,*slstep;
	double *t1,*t2;
	
	
	delta = ioval[0];clen = ioval[1]; neta = ioval[2];
	
	temp1 = (double*) malloc(sizeof(double) *N);
	slstep = (double*) malloc(sizeof(double) *1);
	t1 = (double*) malloc(sizeof(double) *1);
	t2 = (double*) malloc(sizeof(double) *1);
	
	if (nlen <= delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		delta = nlen;
		
	} else {
		ioval[6] = 0.0;
		if (ioval[7] == 1.0) {
			ioval[7] = 0.0;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i] / dx[i];
			}
			
			tvec = l2norm(temp1,N);
			alpha = tvec*tvec;
			beta = 0.0; 
			
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N + i] * jac[j] /(dx[j] * dx[j]);
				}
				beta += temp*temp;
			}
			tvec = - alpha / beta;
			for (i = 0; i < N;++i) {
				ssd[i] = tvec * jac[i] / dx[i];
			}
			
			clen = alpha * sqrt(alpha) / beta;
			mmult(jac,sN,slstep,1,N,1);
			neta = 0.2 + ((0.8 * alpha * alpha) /(beta *fabs(slstep[0])));
			
			for (i = 0; i < N;++i) {
				v[i] = neta * dx[i] *sN[i] - ssd[i];
			}
			
			if (delta == -1.0) {
				if (clen < maxstep) {
					delta = clen;
				} else {
					delta = maxstep;
				}
			}
			
		}
		
		if (neta * nlen <= delta) {
			tvec = delta / nlen;
			for(i = 0; i < N;++i) {
				step[i] = tvec * sN[i];
			}
		} else if (clen >= delta) {
			tvec = delta /clen;
			for (i = 0; i < N;++i) {
				step[i] = tvec * ssd[i] / dx[i];
			}
		} else {
			mmult(v,ssd,t1,1,N,1);
			mmult(v,v,t2,1,N,1);
			lambda = (-t1[0] + sqrt(t1[0]*t1[0] - t2[0]*(clen*clen - delta*delta)))/t2[0];
			
			for (i = 0; i < N; ++i) {
				step[i] = (ssd[i] / dx[i]) + (lambda * v[i] / dx[i] );
			}
		}
		
			
	}
	
	ioval[0] = delta; ioval[1] = clen; ioval[2] = neta;
	
	free(temp1);
	free(t1);
	free(t2);
	free(slstep);
}